

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O0

int SUNMatCopyOps(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix B_local;
  SUNMatrix A_local;
  int local_4;
  
  if ((A == (SUNMatrix)0x0) || (B == (SUNMatrix)0x0)) {
    local_4 = -1;
  }
  else if ((A->ops == (SUNMatrix_Ops)0x0) || (B->ops == (SUNMatrix_Ops)0x0)) {
    local_4 = -1;
  }
  else {
    B->ops->getid = A->ops->getid;
    B->ops->clone = A->ops->clone;
    B->ops->destroy = A->ops->destroy;
    B->ops->zero = A->ops->zero;
    B->ops->copy = A->ops->copy;
    B->ops->scaleadd = A->ops->scaleadd;
    B->ops->scaleaddi = A->ops->scaleaddi;
    B->ops->matvecsetup = A->ops->matvecsetup;
    B->ops->matvec = A->ops->matvec;
    B->ops->space = A->ops->space;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNMatCopyOps(SUNMatrix A, SUNMatrix B)
{
  /* Check that ops structures exist */
  if (A == NULL || B == NULL) return(-1);
  if (A->ops == NULL || B->ops == NULL) return(-1);

  /* Copy ops from A to B */
  B->ops->getid       = A->ops->getid;
  B->ops->clone       = A->ops->clone;
  B->ops->destroy     = A->ops->destroy;
  B->ops->zero        = A->ops->zero;
  B->ops->copy        = A->ops->copy;
  B->ops->scaleadd    = A->ops->scaleadd;
  B->ops->scaleaddi   = A->ops->scaleaddi;
  B->ops->matvecsetup = A->ops->matvecsetup;
  B->ops->matvec      = A->ops->matvec;
  B->ops->space       = A->ops->space;

  return(0);
}